

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall DLevelScript::GetPlayerInput(DLevelScript *this,int playernum,int inputnum)

{
  AActor *pAVar1;
  int iVar2;
  player_t *p;
  
  if (playernum < 0) {
    pAVar1 = (this->activator).field_0.p;
    if (pAVar1 != (AActor *)0x0) {
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        p = pAVar1->player;
        if (p != (player_t *)0x0) goto LAB_0050ee93;
      }
      else {
        (this->activator).field_0.p = (AActor *)0x0;
      }
    }
  }
  else if (((uint)playernum < 8) && (playeringame[(uint)playernum] == true)) {
    p = (player_t *)(&players + (ulong)(uint)playernum * 0x54);
LAB_0050ee93:
    iVar2 = P_Thing_CheckInputNum(p,inputnum);
    return iVar2;
  }
  return 0;
}

Assistant:

int DLevelScript::GetPlayerInput(int playernum, int inputnum)
{
	player_t *p;

	if (playernum < 0)
	{
		if (activator == NULL)
		{
			return 0;
		}
		p = activator->player;
	}
	else if (playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return 0;
	}
	else
	{
		p = &players[playernum];
	}
	if (p == NULL)
	{
		return 0;
	}

	return P_Thing_CheckInputNum(p, inputnum);
}